

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
hashStringifyModule(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   Module *wasm)

{
  undefined1 local_210 [8];
  HashStringifyWalker stringify;
  Module *wasm_local;
  
  stringify.idxToFuncName._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)wasm;
  memset((HashStringifyWalker *)local_210,0,0x1f8);
  ::wasm::HashStringifyWalker::HashStringifyWalker((HashStringifyWalker *)local_210);
  ::wasm::
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  ::walkModule((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)local_210,
               (Module *)stringify.idxToFuncName._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&stringify.super_StringifyWalker<wasm::HashStringifyWalker>.controlFlowQueue.c.
                     super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Deque_impl_data + 0x48));
  ::wasm::HashStringifyWalker::~HashStringifyWalker((HashStringifyWalker *)local_210);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> hashStringifyModule(Module* wasm) {
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(wasm);
  return stringify.hashString;
}